

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontendTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e7fc::BuildSystemFrontendTest_commandSkipping_NonExternalCommands_mkdir_Test::
~BuildSystemFrontendTest_commandSkipping_NonExternalCommands_mkdir_Test
          (BuildSystemFrontendTest_commandSkipping_NonExternalCommands_mkdir_Test *this)

{
  BuildSystemFrontendTest_commandSkipping_NonExternalCommands_mkdir_Test *this_local;
  
  ~BuildSystemFrontendTest_commandSkipping_NonExternalCommands_mkdir_Test(this);
  operator_delete(this,0x228);
  return;
}

Assistant:

TEST_F(BuildSystemFrontendTest, commandSkipping_NonExternalCommands_mkdir) {
  writeBuildFile(R"END(
client:
    name: client

targets:
    "": ["2"]

commands:
    1:
        tool: mkdir
        outputs: ["1"]
    2:
        tool: mkdir
        inputs: ["1"]
        outputs: ["2"]
)END");

  TestBuildSystemFrontendDelegate delegate(sourceMgr);
  delegate.commandsToSkip.insert("1");
  
  BuildSystemFrontend frontend(delegate, invocation, createLocalFileSystem());
  ASSERT_TRUE(frontend.build(""));

  ASSERT_TRUE(delegate.checkTrace(R"END(
commandPreparing: 2
commandPreparing: 1
shouldCommandStart: 1
commandFinished: 1: 3
shouldCommandStart: 2
commandStarted: 2
commandFinished: 2: 0
)END"));
}